

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O2

char * bson_iter_dup_utf8(bson_iter_t *iter,uint32_t *length)

{
  char *__src;
  char *__dest;
  uint32_t local_length;
  uint32_t local_1c;
  
  local_1c = 0;
  if (iter != (bson_iter_t *)0x0) {
    __src = bson_iter_utf8(iter,&local_1c);
    if (__src == (char *)0x0) {
      __dest = (char *)0x0;
    }
    else {
      __dest = (char *)bson_malloc0((ulong)(local_1c + 1));
      memcpy(__dest,__src,(ulong)local_1c);
      __dest[local_1c] = '\0';
    }
    if (length != (uint32_t *)0x0) {
      *length = local_1c;
    }
    return __dest;
  }
  fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
          "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/src/bson/bson-iter.c"
          ,0x522,"bson_iter_dup_utf8","iter");
  abort();
}

Assistant:

char *
bson_iter_dup_utf8 (const bson_iter_t *iter, /* IN */
                    uint32_t *length)        /* OUT */
{
   uint32_t local_length = 0;
   const char *str;
   char *ret = NULL;

   BSON_ASSERT (iter);

   if ((str = bson_iter_utf8 (iter, &local_length))) {
      ret = bson_malloc0 (local_length + 1);
      memcpy (ret, str, local_length);
      ret[local_length] = '\0';
   }

   if (length) {
      *length = local_length;
   }

   return ret;
}